

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_bool32 drmp3__on_seek(drmp3 *pMP3,int offset,drmp3_seek_origin origin)

{
  code *pcVar1;
  SDL_AssertState SVar2;
  drmp3_bool32 dVar3;
  SDL_AssertState sdl_assert_state;
  drmp3_seek_origin origin_local;
  int offset_local;
  drmp3 *pMP3_local;
  
  do {
    if (-1 < offset) goto LAB_00129639;
    SVar2 = (*SDL20_ReportAssertion)
                      (&drmp3__on_seek::sdl_assert_data,"drmp3__on_seek",
                       "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/dr_mp3.h"
                       ,0xa39);
  } while (SVar2 == SDL_ASSERTION_RETRY);
  if (SVar2 == SDL_ASSERTION_BREAK) {
    pcVar1 = (code *)swi(3);
    dVar3 = (*pcVar1)();
    return dVar3;
  }
LAB_00129639:
  dVar3 = (*pMP3->onSeek)(pMP3->pUserData,offset,origin);
  if (dVar3 == 0) {
    pMP3_local._4_4_ = 0;
  }
  else {
    if (origin == drmp3_seek_origin_start) {
      pMP3->streamCursor = (long)offset;
    }
    else {
      pMP3->streamCursor = (long)offset + pMP3->streamCursor;
    }
    pMP3_local._4_4_ = 1;
  }
  return pMP3_local._4_4_;
}

Assistant:

static drmp3_bool32 drmp3__on_seek(drmp3* pMP3, int offset, drmp3_seek_origin origin)
{
    DRMP3_ASSERT(offset >= 0);

    if (!pMP3->onSeek(pMP3->pUserData, offset, origin)) {
        return DRMP3_FALSE;
    }

    if (origin == drmp3_seek_origin_start) {
        pMP3->streamCursor = (drmp3_uint64)offset;
    } else {
        pMP3->streamCursor += offset;
    }

    return DRMP3_TRUE;
}